

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_back_compat_test_common.c
# Opt level: O3

_Bool is_operation_timed_out
                (TICK_COUNTER_HANDLE tick_cntr_handle,tickcounter_ms_t compare_time,
                size_t timeout_seconds)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  _Bool _Var3;
  tickcounter_ms_t curr_tick;
  tickcounter_ms_t local_10;
  
  iVar1 = tickcounter_get_current_ms(tick_cntr_handle,&local_10);
  if (iVar1 == 0) {
    _Var3 = 0x1d8a7 < local_10 - compare_time;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    _Var3 = true;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/tests/common_test_files/iothub_back_compat_test_common.c"
                ,"is_operation_timed_out",0x53,1,"Failure getting tickcounter value");
    }
  }
  return _Var3;
}

Assistant:

static bool is_operation_timed_out(TICK_COUNTER_HANDLE tick_cntr_handle, tickcounter_ms_t compare_time, size_t timeout_seconds)
{
    bool result;
    tickcounter_ms_t curr_tick;
    if (tickcounter_get_current_ms(tick_cntr_handle, &curr_tick) != 0)
    {
        LogError("Failure getting tickcounter value");
        result = true;
    }
    else
    {
        result = (((curr_tick - compare_time) / 1000 > timeout_seconds));
    }
    return result;
}